

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.cpp
# Opt level: O0

void __thiscall QueryResult::do_or(QueryResult *this,QueryResult *other,QueryCounter *counter)

{
  bool bVar1;
  QueryResult *in_RSI;
  QueryResult *in_RDI;
  SortedRun *in_stack_00000008;
  SortedRun *in_stack_00000010;
  QueryOperation op;
  SortedRun *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  QueryOperation *in_stack_ffffffffffffffb0;
  
  QueryOperation::QueryOperation
            ((QueryOperation *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             (QueryCounter *)in_stack_ffffffffffffff78);
  bVar1 = is_everything(in_RDI);
  if (!bVar1) {
    in_stack_ffffffffffffff87 = is_everything(in_RSI);
    if (!(bool)in_stack_ffffffffffffff87) {
      SortedRun::do_or(in_stack_00000010,in_stack_00000008);
      goto LAB_00255916;
    }
  }
  in_RDI->has_everything = true;
  SortedRun::SortedRun((SortedRun *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  SortedRun::operator=
            ((SortedRun *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  SortedRun::~SortedRun((SortedRun *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
LAB_00255916:
  QueryOperation::~QueryOperation(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void QueryResult::do_or(QueryResult &&other, QueryCounter *counter) {
    auto op = QueryOperation(counter);
    if (this->is_everything() || other.is_everything()) {
        has_everything = true;
        results = std::move(SortedRun());
    } else {
        results.do_or(other.results);
    }
}